

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[32],char[29],unsigned_int,char[43],unsigned_int,char[45],unsigned_int,char[30]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [32],char (*Args_1) [29],
          uint *Args_2,char (*Args_3) [43],uint *Args_4,char (*Args_5) [45],uint *Args_6,
          char (*Args_7) [30])

{
  stringstream local_1c8 [8];
  stringstream ss;
  uint *Args_local_4;
  char (*Args_local_3) [43];
  uint *Args_local_2;
  char (*Args_local_1) [29];
  char (*Args_local) [32];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[32],char[29],unsigned_int,char[43],unsigned_int,char[45],unsigned_int,char[30]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [32])this,(char (*) [29])Args,(uint *)Args_1,(char (*) [43])Args_2,
             (uint *)Args_3,(char (*) [45])Args_4,(uint *)Args_5,(char (*) [30])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}